

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::InstanceIntersectorK<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  NodeRef *pNVar1;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar2;
  size_t sVar3;
  undefined4 uVar4;
  NodeRef *pNVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  Primitive *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  bool bVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar14;
  undefined1 auVar15 [64];
  vint4 ai_2;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar23;
  vint4 ai;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar26;
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 ai_3;
  undefined1 auVar29 [16];
  vint4 bi;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 bi_1;
  undefined1 auVar33 [16];
  vint4 bi_3;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 bi_2;
  undefined1 auVar36 [64];
  float fVar37;
  float fVar40;
  float fVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar54;
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  Precalculations pre;
  vint4 bi_8;
  vbool<4> valid_leaf;
  undefined1 local_1758 [16];
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16e8;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      intersectCoherent(valid_i,This,ray,context);
      return;
    }
    auVar39 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar17 = vpcmpeqd_avx((undefined1  [16])valid_i->field_0,auVar39);
    iVar6 = vmovmskps_avx(auVar17);
    uVar7 = CONCAT44((int)((ulong)This >> 0x20),iVar6);
    if (iVar6 != 0) {
      auVar18 = *(undefined1 (*) [16])(ray + 0x40);
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx(auVar18,auVar16);
      auVar30._8_4_ = 0x219392ef;
      auVar30._0_8_ = 0x219392ef219392ef;
      auVar30._12_4_ = 0x219392ef;
      auVar24 = vcmpps_avx(auVar24,auVar30,1);
      auVar19 = vblendvps_avx(auVar18,auVar30,auVar24);
      auVar24 = *(undefined1 (*) [16])(ray + 0x50);
      auVar34 = vandps_avx(auVar24,auVar16);
      auVar34 = vcmpps_avx(auVar34,auVar30,1);
      auVar20 = vblendvps_avx(auVar24,auVar30,auVar34);
      auVar34 = *(undefined1 (*) [16])(ray + 0x60);
      auVar16 = vandps_avx(auVar34,auVar16);
      auVar16 = vcmpps_avx(auVar16,auVar30,1);
      auVar16 = vblendvps_avx(auVar34,auVar30,auVar16);
      auVar30 = vrcpps_avx(auVar19);
      local_1728 = auVar30._0_4_;
      auVar27._0_4_ = auVar19._0_4_ * local_1728;
      fStack_1724 = auVar30._4_4_;
      auVar27._4_4_ = auVar19._4_4_ * fStack_1724;
      fStack_1720 = auVar30._8_4_;
      auVar27._8_4_ = auVar19._8_4_ * fStack_1720;
      fStack_171c = auVar30._12_4_;
      auVar27._12_4_ = auVar19._12_4_ * fStack_171c;
      auVar43._8_4_ = 0x3f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._12_4_ = 0x3f800000;
      auVar30 = vsubps_avx(auVar43,auVar27);
      auVar19 = vrcpps_avx(auVar20);
      local_1738 = auVar19._0_4_;
      auVar31._0_4_ = auVar20._0_4_ * local_1738;
      fStack_1734 = auVar19._4_4_;
      auVar31._4_4_ = auVar20._4_4_ * fStack_1734;
      fStack_1730 = auVar19._8_4_;
      auVar31._8_4_ = auVar20._8_4_ * fStack_1730;
      fStack_172c = auVar19._12_4_;
      auVar31._12_4_ = auVar20._12_4_ * fStack_172c;
      auVar20 = vsubps_avx(auVar43,auVar31);
      auVar19 = vrcpps_avx(auVar16);
      local_1748 = auVar19._0_4_;
      auVar38._0_4_ = auVar16._0_4_ * local_1748;
      fStack_1744 = auVar19._4_4_;
      auVar38._4_4_ = auVar16._4_4_ * fStack_1744;
      fStack_1740 = auVar19._8_4_;
      auVar38._8_4_ = auVar16._8_4_ * fStack_1740;
      fStack_173c = auVar19._12_4_;
      auVar38._12_4_ = auVar16._12_4_ * fStack_173c;
      auVar16 = vsubps_avx(auVar43,auVar38);
      auVar19 = ZEXT816(0);
      auVar18 = vcmpps_avx(auVar18,auVar19,1);
      auVar50._8_4_ = 1;
      auVar50._0_8_ = 0x100000001;
      auVar50._12_4_ = 1;
      auVar18 = vandps_avx(auVar50,auVar18);
      auVar24 = vcmpps_avx(auVar24,auVar19,1);
      auVar51._8_4_ = 2;
      auVar51._0_8_ = 0x200000002;
      auVar51._12_4_ = 2;
      auVar24 = vandps_avx(auVar51,auVar24);
      auVar24 = vorps_avx(auVar24,auVar18);
      auVar55 = ZEXT1664(*(undefined1 (*) [16])ray);
      auVar18 = vcmpps_avx(auVar34,auVar19,1);
      auVar34._8_4_ = 4;
      auVar34._0_8_ = 0x400000004;
      auVar34._12_4_ = 4;
      auVar18 = vandps_avx(auVar18,auVar34);
      auVar44 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x10));
      auVar56 = ZEXT1664(*(undefined1 (*) [16])(ray + 0x20));
      auVar39 = vpor_avx(auVar17 ^ auVar39,auVar18);
      local_1758 = vpor_avx(auVar24,auVar39);
      do {
        lVar8 = 0;
        if (uVar7 != 0) {
          for (; (uVar7 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
          }
        }
        uVar4 = *(undefined4 *)(local_1758 + lVar8 * 4);
        auVar39._4_4_ = uVar4;
        auVar39._0_4_ = uVar4;
        auVar39._8_4_ = uVar4;
        auVar39._12_4_ = uVar4;
        auVar39 = vpcmpeqd_avx(auVar39,local_1758);
        uVar4 = vmovmskps_avx(auVar39);
        uVar7 = uVar7 & ~CONCAT44((int)((ulong)lVar8 >> 0x20),uVar4);
      } while (uVar7 != 0);
      local_1758 = vpcmpeqd_avx(local_1758,local_1758);
      auVar18 = vpcmpeqd_avx(local_1758,(undefined1  [16])valid_i->field_0);
      local_1728 = local_1728 + auVar30._0_4_ * local_1728;
      fStack_1724 = fStack_1724 + auVar30._4_4_ * fStack_1724;
      fStack_1720 = fStack_1720 + auVar30._8_4_ * fStack_1720;
      fStack_171c = fStack_171c + auVar30._12_4_ * fStack_171c;
      local_1738 = local_1738 + auVar20._0_4_ * local_1738;
      fStack_1734 = fStack_1734 + auVar20._4_4_ * fStack_1734;
      fStack_1730 = fStack_1730 + auVar20._8_4_ * fStack_1730;
      fStack_172c = fStack_172c + auVar20._12_4_ * fStack_172c;
      local_1748 = auVar16._0_4_ * local_1748 + local_1748;
      fStack_1744 = auVar16._4_4_ * fStack_1744 + fStack_1744;
      fStack_1740 = auVar16._8_4_ * fStack_1740 + fStack_1740;
      fStack_173c = auVar16._12_4_ * fStack_173c + fStack_173c;
      auVar39 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      auVar17 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16e8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar39,auVar18);
      auVar24._8_4_ = 0xff800000;
      auVar24._0_8_ = 0xff800000ff800000;
      auVar24._12_4_ = 0xff800000;
      bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                     vblendvps_avx(auVar24,auVar17,auVar18);
      pNVar5 = stack_node + 2;
      paVar12 = &stack_near[2].field_0;
      auVar36 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[1].field_0 = local_16e8;
      local_16f8 = *(undefined1 (*) [16])ray;
      local_1708 = *(undefined1 (*) [16])(ray + 0x10);
      local_1718 = *(undefined1 (*) [16])(ray + 0x20);
      fVar37 = local_1728;
      fVar40 = fStack_1724;
      fVar41 = fStack_1720;
      fVar42 = fStack_171c;
      fVar45 = local_1738;
      fVar46 = fStack_1734;
      fVar47 = fStack_1730;
      fVar48 = fStack_172c;
      fVar49 = local_1748;
      fVar52 = fStack_1744;
      fVar53 = fStack_1740;
      fVar54 = fStack_173c;
LAB_00ed0034:
      pNVar1 = pNVar5 + -1;
      if (pNVar1->ptr != 0xfffffffffffffff8) {
        pNVar5 = pNVar5 + -1;
        paVar2 = paVar12 + -1;
        auVar15 = ZEXT1664((undefined1  [16])*paVar2);
        paVar12 = paVar12 + -1;
        auVar39 = vcmpps_avx((undefined1  [16])*paVar2,(undefined1  [16])bi_8.field_0,1);
        sVar11 = pNVar1->ptr;
        if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar39[0xf] < '\0') {
          while ((sVar11 & 8) == 0) {
            auVar15 = ZEXT1664(auVar36._0_16_);
            uVar7 = 0;
            sVar3 = 8;
            for (lVar8 = 0;
                (lVar8 != 4 &&
                (sVar10 = *(size_t *)((sVar11 & 0xfffffffffffffff0) + lVar8 * 8), sVar10 != 8));
                lVar8 = lVar8 + 1) {
              uVar4 = *(undefined4 *)(sVar11 + 0x20 + lVar8 * 4);
              auVar17._4_4_ = uVar4;
              auVar17._0_4_ = uVar4;
              auVar17._8_4_ = uVar4;
              auVar17._12_4_ = uVar4;
              auVar39 = vsubps_avx(auVar17,auVar55._0_16_);
              auVar25._0_4_ = fVar37 * auVar39._0_4_;
              auVar25._4_4_ = fVar40 * auVar39._4_4_;
              auVar25._8_4_ = fVar41 * auVar39._8_4_;
              auVar25._12_4_ = fVar42 * auVar39._12_4_;
              uVar4 = *(undefined4 *)(sVar11 + 0x40 + lVar8 * 4);
              auVar18._4_4_ = uVar4;
              auVar18._0_4_ = uVar4;
              auVar18._8_4_ = uVar4;
              auVar18._12_4_ = uVar4;
              auVar39 = vsubps_avx(auVar18,auVar44._0_16_);
              auVar28._0_4_ = fVar45 * auVar39._0_4_;
              auVar28._4_4_ = fVar46 * auVar39._4_4_;
              auVar28._8_4_ = fVar47 * auVar39._8_4_;
              auVar28._12_4_ = fVar48 * auVar39._12_4_;
              uVar4 = *(undefined4 *)(sVar11 + 0x60 + lVar8 * 4);
              auVar19._4_4_ = uVar4;
              auVar19._0_4_ = uVar4;
              auVar19._8_4_ = uVar4;
              auVar19._12_4_ = uVar4;
              auVar39 = vsubps_avx(auVar19,auVar56._0_16_);
              auVar29._0_4_ = fVar49 * auVar39._0_4_;
              auVar29._4_4_ = fVar52 * auVar39._4_4_;
              auVar29._8_4_ = fVar53 * auVar39._8_4_;
              auVar29._12_4_ = fVar54 * auVar39._12_4_;
              uVar4 = *(undefined4 *)(sVar11 + 0x30 + lVar8 * 4);
              auVar20._4_4_ = uVar4;
              auVar20._0_4_ = uVar4;
              auVar20._8_4_ = uVar4;
              auVar20._12_4_ = uVar4;
              auVar39 = vsubps_avx(auVar20,auVar55._0_16_);
              auVar32._0_4_ = fVar37 * auVar39._0_4_;
              auVar32._4_4_ = fVar40 * auVar39._4_4_;
              auVar32._8_4_ = fVar41 * auVar39._8_4_;
              auVar32._12_4_ = fVar42 * auVar39._12_4_;
              uVar4 = *(undefined4 *)(sVar11 + 0x50 + lVar8 * 4);
              auVar21._4_4_ = uVar4;
              auVar21._0_4_ = uVar4;
              auVar21._8_4_ = uVar4;
              auVar21._12_4_ = uVar4;
              auVar39 = vsubps_avx(auVar21,auVar44._0_16_);
              auVar33._0_4_ = fVar45 * auVar39._0_4_;
              auVar33._4_4_ = fVar46 * auVar39._4_4_;
              auVar33._8_4_ = fVar47 * auVar39._8_4_;
              auVar33._12_4_ = fVar48 * auVar39._12_4_;
              uVar4 = *(undefined4 *)(sVar11 + 0x70 + lVar8 * 4);
              auVar22._4_4_ = uVar4;
              auVar22._0_4_ = uVar4;
              auVar22._8_4_ = uVar4;
              auVar22._12_4_ = uVar4;
              auVar39 = vsubps_avx(auVar22,auVar56._0_16_);
              auVar35._0_4_ = fVar49 * auVar39._0_4_;
              auVar35._4_4_ = fVar52 * auVar39._4_4_;
              auVar35._8_4_ = fVar53 * auVar39._8_4_;
              auVar35._12_4_ = fVar54 * auVar39._12_4_;
              auVar39 = vpminsd_avx(auVar25,auVar32);
              auVar17 = vpminsd_avx(auVar28,auVar33);
              auVar39 = vpmaxsd_avx(auVar39,auVar17);
              auVar17 = vpminsd_avx(auVar29,auVar35);
              auVar17 = vpmaxsd_avx(auVar39,auVar17);
              auVar39 = vpmaxsd_avx(auVar25,auVar32);
              auVar18 = vpmaxsd_avx(auVar28,auVar33);
              auVar24 = vpminsd_avx(auVar39,auVar18);
              auVar39 = vpmaxsd_avx(auVar29,auVar35);
              auVar18 = vpmaxsd_avx(auVar17,(undefined1  [16])local_16e8);
              auVar39 = vpminsd_avx(auVar39,(undefined1  [16])bi_8.field_0);
              auVar39 = vpminsd_avx(auVar24,auVar39);
              auVar39 = vcmpps_avx(auVar18,auVar39,2);
              if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar39[0xf] < '\0') {
                aVar26 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar36._0_16_,auVar17,auVar39);
                aVar14 = auVar15._0_16_;
                auVar39 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar14,1);
                sVar9 = sVar3;
                aVar23 = aVar26;
                if (((((auVar39 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     -1 < auVar39[0xf]) ||
                   (sVar9 = sVar10, sVar10 = sVar3, aVar23 = aVar14, aVar14 = aVar26, sVar3 != 8)) {
                  aVar26 = aVar14;
                  uVar7 = uVar7 + 1;
                  pNVar5->ptr = sVar10;
                  pNVar5 = pNVar5 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12->v = aVar23;
                  paVar12 = paVar12 + 1;
                }
                sVar3 = sVar9;
                auVar15 = ZEXT1664((undefined1  [16])aVar26);
              }
            }
            if (sVar3 == 8) goto LAB_00ed0034;
            sVar11 = sVar3;
            if (1 < uVar7) {
              aVar26 = paVar12[-2];
              aVar23 = paVar12[-1];
              auVar39 = vcmpps_avx((undefined1  [16])aVar26,(undefined1  [16])aVar23,1);
              aVar14 = aVar23;
              if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar39[0xf] < '\0') {
                paVar12[-2] = aVar23;
                paVar12[-1] = aVar26;
                auVar39 = vpermilps_avx(*(undefined1 (*) [16])(pNVar5 + -2),0x4e);
                *(undefined1 (*) [16])(pNVar5 + -2) = auVar39;
                aVar14 = aVar26;
                aVar26 = aVar23;
              }
              if (uVar7 != 2) {
                aVar23 = paVar12[-3];
                auVar39 = vcmpps_avx((undefined1  [16])aVar23,(undefined1  [16])aVar14,1);
                if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar39[0xf] < '\0') {
                  paVar12[-3] = aVar14;
                  paVar12[-1] = aVar23;
                  sVar3 = pNVar5[-3].ptr;
                  pNVar5[-3].ptr = pNVar5[-1].ptr;
                  pNVar5[-1].ptr = sVar3;
                  aVar23 = aVar14;
                }
                auVar39 = vcmpps_avx((undefined1  [16])aVar23,(undefined1  [16])aVar26,1);
                if ((((auVar39 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar39 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar39 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar39[0xf] < '\0') {
                  paVar12[-3] = aVar26;
                  paVar12[-2] = aVar23;
                  auVar39 = vpermilps_avx(*(undefined1 (*) [16])(pNVar5 + -3),0x4e);
                  *(undefined1 (*) [16])(pNVar5 + -3) = auVar39;
                }
              }
            }
          }
          if (sVar11 == 0xfffffffffffffff8) {
            return;
          }
          valid_leaf.field_0 =
               (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
               vcmpps_avx((undefined1  [16])bi_8.field_0,auVar15._0_16_,6);
          if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                (undefined1  [16])0x0 ||
               ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
               (undefined1  [16])0x0) ||
              ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
            lVar8 = (ulong)((uint)sVar11 & 0xf) - 8;
            prim = (Primitive *)(sVar11 & 0xfffffffffffffff0);
            while (bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
              InstanceIntersectorK<4>::intersect(&valid_leaf,&pre,ray,context,prim);
              auVar36 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              prim = prim + 1;
            }
            bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                           vblendvps_avx((undefined1  [16])bi_8.field_0,
                                         *(undefined1 (*) [16])(ray + 0x80),
                                         (undefined1  [16])valid_leaf.field_0);
            auVar55 = ZEXT1664(local_16f8);
            auVar44 = ZEXT1664(local_1708);
            auVar56 = ZEXT1664(local_1718);
            fVar37 = local_1728;
            fVar40 = fStack_1724;
            fVar41 = fStack_1720;
            fVar42 = fStack_171c;
            fVar45 = local_1738;
            fVar46 = fStack_1734;
            fVar47 = fStack_1730;
            fVar48 = fStack_172c;
            fVar49 = local_1748;
            fVar52 = fStack_1744;
            fVar53 = fStack_1740;
            fVar54 = fStack_173c;
          }
        }
        goto LAB_00ed0034;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }